

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
helics::ValueFederateManager::queryUpdates
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ValueFederateManager *this)

{
  iterator __position;
  int iVar1;
  int iVar2;
  int iVar3;
  Input *inp;
  Input *pIVar4;
  ulong uVar5;
  Input **ppIVar6;
  Input **ppIVar7;
  int ii;
  shared_handle inpHandle;
  int local_4c;
  shared_handle local_48;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(&local_48,&this->inputs);
  local_4c = 0;
  if (((local_48.data)->dataStorage).csize == 0) {
    iVar3 = ((local_48.data)->dataStorage).bsize;
    uVar5 = (ulong)iVar3;
    ppIVar6 = ((local_48.data)->dataStorage).dataptr;
    if (uVar5 != 0x20) {
      ppIVar7 = ppIVar6 + ((local_48.data)->dataStorage).dataSlotIndex;
      pIVar4 = *ppIVar7 + uVar5;
      goto LAB_00258677;
    }
    if (ppIVar6 == (Input **)0x0) {
      ppIVar7 = (Input **)
                &gmlc::containers::StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>
                 ::end()::emptyValue;
    }
    else {
      ppIVar7 = ppIVar6 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
    }
    pIVar4 = *ppIVar7;
  }
  else {
    ppIVar6 = ((local_48.data)->dataStorage).dataptr;
    pIVar4 = *ppIVar6;
    iVar3 = ((local_48.data)->dataStorage).bsize;
    uVar5 = 0;
    ppIVar7 = ppIVar6;
    if (iVar3 != 0x20) {
LAB_00258677:
      ppIVar6 = ppIVar6 + ((local_48.data)->dataStorage).dataSlotIndex;
      goto LAB_002586af;
    }
  }
  if (ppIVar6 == (Input **)0x0) {
    ppIVar6 = (Input **)
              &gmlc::containers::StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::
               end()::emptyValue;
  }
  else {
    ppIVar6 = ppIVar6 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
  }
  uVar5 = 0;
  iVar3 = 0;
LAB_002586af:
  iVar2 = (int)uVar5;
  while ((iVar1 = (int)uVar5, iVar2 != iVar3 || (ppIVar7 != ppIVar6))) {
    if (pIVar4->hasUpdate == true) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_4c);
      }
      else {
        *__position._M_current = local_4c;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    local_4c = local_4c + 1;
    uVar5 = (ulong)(iVar1 + 1U);
    if (iVar1 < 0x1f) {
      pIVar4 = pIVar4 + 1;
    }
    else {
      ppIVar7 = ppIVar7 + (ulong)(iVar1 - 0x1fU >> 5) + 1;
      uVar5 = (ulong)(iVar1 + 1U & 0x1f);
      pIVar4 = *ppIVar7 + uVar5;
    }
    iVar2 = (int)uVar5;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ValueFederateManager::queryUpdates()
{
    std::vector<int> updates;
    auto inpHandle = inputs.lock_shared();
    int ii = 0;
    for (const auto& inp : *inpHandle) {
        if (inp.hasUpdate) {
            updates.push_back(ii);
        }
        ++ii;
    }
    return updates;
}